

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrppm.c
# Opt level: O0

void put_rgb(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 *puVar5;
  long in_RSI;
  long in_RDI;
  int ps;
  int bindex;
  int gindex;
  int rindex;
  JDIMENSION col;
  JSAMPROW ptr;
  char *bufferptr;
  ppm_dest_ptr dest;
  int local_34;
  long local_30;
  undefined1 *local_28;
  
  iVar1 = rgb_red[*(uint *)(in_RDI + 0x40)];
  iVar2 = rgb_green[*(uint *)(in_RDI + 0x40)];
  iVar3 = rgb_blue[*(uint *)(in_RDI + 0x40)];
  iVar4 = rgb_pixelsize[*(uint *)(in_RDI + 0x40)];
  local_30 = **(long **)(in_RSI + 0x28);
  local_28 = *(undefined1 **)(in_RSI + 0x38);
  for (local_34 = *(int *)(in_RDI + 0x88); local_34 != 0; local_34 = local_34 + -1) {
    *local_28 = *(undefined1 *)(local_30 + iVar1);
    puVar5 = local_28 + 2;
    local_28[1] = *(undefined1 *)(local_30 + iVar2);
    local_28 = local_28 + 3;
    *puVar5 = *(undefined1 *)(local_30 + iVar3);
    local_30 = local_30 + iVar4;
  }
  fwrite(*(void **)(in_RSI + 0x38),1,*(size_t *)(in_RSI + 0x48),*(FILE **)(in_RSI + 0x20));
  return;
}

Assistant:

METHODDEF(void)
put_rgb(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo, JDIMENSION rows_supplied)
{
  ppm_dest_ptr dest = (ppm_dest_ptr)dinfo;
  register char *bufferptr;
  register JSAMPROW ptr;
  register JDIMENSION col;
  register int rindex = rgb_red[cinfo->out_color_space];
  register int gindex = rgb_green[cinfo->out_color_space];
  register int bindex = rgb_blue[cinfo->out_color_space];
  register int ps = rgb_pixelsize[cinfo->out_color_space];

  ptr = dest->pub.buffer[0];
  bufferptr = dest->iobuffer;
  for (col = cinfo->output_width; col > 0; col--) {
    PUTPPMSAMPLE(bufferptr, ptr[rindex]);
    PUTPPMSAMPLE(bufferptr, ptr[gindex]);
    PUTPPMSAMPLE(bufferptr, ptr[bindex]);
    ptr += ps;
  }
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}